

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O0

void __thiscall
qclab::qgates::Phase<std::complex<float>_>::Phase
          (Phase<std::complex<float>_> *this,real_type cos,real_type sin)

{
  real_type sin_local;
  real_type cos_local;
  Phase<std::complex<float>_> *this_local;
  
  QGate1<std::complex<float>_>::QGate1(&this->super_QGate1<std::complex<float>_>,0);
  QAdjustable::QAdjustable
            ((QAdjustable *)&(this->super_QGate1<std::complex<float>_>).field_0xc,false);
  (this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00179d00;
  QAngle<float>::QAngle(&this->angle_,cos,sin);
  return;
}

Assistant:

Phase( const real_type cos , const real_type sin )
        : QGate1< T >( 0 )
        , angle_( cos , sin )
        , QAdjustable( false )
        { }